

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zp_field.h
# Opt level: O2

Zp_field_element<2U,_unsigned_int,_void> __thiscall
Gudhi::persistence_fields::Zp_field_element<2U,_unsigned_int,_void>::get_inverse
          (Zp_field_element<2U,_unsigned_int,_void> *this)

{
  uint uVar1;
  uint *in_RSI;
  ulong uVar2;
  
  uVar2 = (ulong)*in_RSI;
  if (uVar2 == 0) {
    uVar2 = 0;
  }
  else if (inverse_._M_elems[uVar2] == 0) {
    uVar1 = _get_inverse(*in_RSI);
    inverse_._M_elems[*in_RSI] = uVar1;
    uVar2 = (ulong)*in_RSI;
  }
  this->element_ = inverse_._M_elems[uVar2] & 1;
  return (Zp_field_element<2U,_unsigned_int,_void>)(Element_conflict)this;
}

Assistant:

Zp_field_element get_inverse() const {
    if (element_ != 0 && inverse_[element_] == 0) {  // initialize everything at instantiation instead?
      inverse_[element_] = _get_inverse(element_);
    }

    return Zp_field_element<characteristic>(inverse_[element_]);
  }